

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,StringPiece input,MessageLite *msg,ParseFlags parse_flags)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  MessageLite *this_00;
  StringPiece flat;
  EpsCopyInputStream local_90;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  this_00 = (MessageLite *)input.length_;
  local_90.zcis_ = (ZeroCopyInputStream *)0x0;
  local_90.buffer_[0] = '\0';
  local_90.buffer_[1] = '\0';
  local_90.buffer_[2] = '\0';
  local_90.buffer_[3] = '\0';
  local_90.buffer_[4] = '\0';
  local_90.buffer_[5] = '\0';
  local_90.buffer_[6] = '\0';
  local_90.buffer_[7] = '\0';
  local_90.buffer_[8] = '\0';
  local_90.buffer_[9] = '\0';
  local_90.buffer_[10] = '\0';
  local_90.buffer_[0xb] = '\0';
  local_90.buffer_[0xc] = '\0';
  local_90.buffer_[0xd] = '\0';
  local_90.buffer_[0xe] = '\0';
  local_90.buffer_[0xf] = '\0';
  local_90.buffer_[0x10] = '\0';
  local_90.buffer_[0x11] = '\0';
  local_90.buffer_[0x12] = '\0';
  local_90.buffer_[0x13] = '\0';
  local_90.buffer_[0x14] = '\0';
  local_90.buffer_[0x15] = '\0';
  local_90.buffer_[0x16] = '\0';
  local_90.buffer_[0x17] = '\0';
  local_90.buffer_[0x18] = '\0';
  local_90.buffer_[0x19] = '\0';
  local_90.buffer_[0x1a] = '\0';
  local_90.buffer_[0x1b] = '\0';
  local_90.buffer_[0x1c] = '\0';
  local_90.buffer_[0x1d] = '\0';
  local_90.buffer_[0x1e] = '\0';
  local_90.buffer_[0x1f] = '\0';
  local_90.aliasing_ = 0;
  local_90.last_tag_minus_1_ = 0;
  local_90.overall_limit_ = 0x7fffffff;
  local_38 = io::CodedInputStream::default_recursion_limit_;
  local_34 = 0x80000000;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  flat.length_ = (size_type)input.ptr_;
  flat.ptr_ = (char *)this;
  pcVar3 = EpsCopyInputStream::InitFrom(&local_90,flat);
  iVar2 = (*this_00->_vptr_MessageLite[10])(this_00,pcVar3,&local_90);
  cVar1 = '\0';
  if ((CONCAT44(extraout_var,iVar2) != 0) && (local_90.last_tag_minus_1_ == 0)) {
    if (((ulong)msg & 2) == 0) {
      iVar2 = (*this_00->_vptr_MessageLite[5])(this_00);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') {
        MessageLite::LogInitializationErrorMessage(this_00);
      }
    }
    else {
      cVar1 = '\x01';
    }
  }
  return (bool)cVar1;
}

Assistant:

bool MergeFromImpl(StringPiece input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}